

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O2

int VP8RecordCoeffTokens(int ctx,VP8Residual *res,VP8TBuffer *tokens)

{
  long lVar1;
  proba_t *stats;
  byte bVar2;
  ushort uVar3;
  int16_t *piVar4;
  StatsArray *paapVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ushort uVar13;
  proba_t (*stats_00) [11];
  uint8_t *puVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  
  piVar4 = res->coeffs;
  iVar15 = res->coeff_type;
  lVar11 = (long)res->last;
  iVar10 = res->first;
  uVar7 = ((iVar10 + iVar15 * 8) * 3 + ctx) * 0xb;
  stats_00 = res->stats[iVar10] + ctx;
  AddToken(tokens,(uint)~res->last >> 0x1f,uVar7,*stats_00);
  if (lVar11 < 0) {
    iVar15 = 0;
  }
  else {
    iVar15 = iVar15 * 8;
    lVar12 = (long)iVar10;
    do {
      while( true ) {
        if (0xf < lVar12) goto LAB_0012f954;
        lVar1 = lVar12 + 1;
        uVar3 = piVar4[lVar12];
        uVar13 = -uVar3;
        if (0 < (short)uVar3) {
          uVar13 = uVar3;
        }
        AddToken(tokens,(uint)(uVar3 != 0),uVar7 + 1,*stats_00 + 1);
        if (uVar3 != 0) break;
        uVar7 = (iVar15 + (uint)""[lVar12 + 1]) * 0x21;
        stats_00 = res->stats[""[lVar12 + 1]];
        lVar12 = lVar1;
      }
      AddToken(tokens,(uint)(1 < uVar13),uVar7 + 2,*stats_00 + 2);
      iVar10 = 0xb;
      lVar17 = 1;
      if (1 < uVar13) {
        AddToken(tokens,(uint)(4 < uVar13),uVar7 + 3,*stats_00 + 3);
        uVar16 = (uint)uVar13;
        if (uVar13 < 5) {
          AddToken(tokens,(uint)(uVar16 != 2),uVar7 + 4,*stats_00 + 4);
          iVar10 = 0x16;
          lVar17 = 2;
          if (uVar13 == 2) goto LAB_0012f850;
          AddToken(tokens,(uint)(uVar13 == 4),uVar7 + 5,*stats_00 + 5);
        }
        else {
          AddToken(tokens,(uint)(10 < uVar13),uVar7 + 6,*stats_00 + 6);
          if (uVar13 < 0xb) {
            AddToken(tokens,(uint)(6 < uVar13),uVar7 + 7,*stats_00 + 7);
            if (uVar13 < 7) {
              uVar8 = (uint32_t)(uVar16 == 6);
              uVar7 = 0x9f;
            }
            else {
              AddConstantToken(tokens,(uint)(8 < uVar13),0xa5);
              uVar8 = ~uVar16 & 1;
              uVar7 = 0x91;
            }
            AddConstantToken(tokens,uVar8,uVar7);
          }
          else {
            uVar9 = uVar13 - 3;
            uVar8 = uVar7 + 8;
            stats = *stats_00 + 8;
            if (uVar9 < 0x10) {
              AddToken(tokens,0,uVar8,stats);
              AddToken(tokens,0,uVar7 + 9,*stats_00 + 9);
              iVar10 = -0xb;
              uVar9 = 4;
              puVar14 = VP8Cat3;
            }
            else if (uVar9 < 0x20) {
              AddToken(tokens,0,uVar8,stats);
              AddToken(tokens,1,uVar7 + 9,*stats_00 + 9);
              iVar10 = -0x13;
              uVar9 = 8;
              puVar14 = VP8Cat4;
            }
            else {
              AddToken(tokens,1,uVar8,stats);
              if (uVar9 < 0x40) {
                AddToken(tokens,0,uVar7 + 10,*stats_00 + 9);
                iVar10 = -0x23;
                uVar9 = 0x10;
                puVar14 = VP8Cat5;
              }
              else {
                AddToken(tokens,1,uVar7 + 10,*stats_00 + 9);
                uVar9 = 0x400;
                iVar10 = -0x43;
                puVar14 = VP8Cat6;
              }
            }
            for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
              bVar2 = *puVar14;
              puVar14 = puVar14 + 1;
              AddConstantToken(tokens,(uint)((uVar9 & iVar10 + uVar16) != 0),(uint)bVar2);
            }
          }
        }
        iVar10 = 0x16;
        lVar17 = 2;
      }
LAB_0012f850:
      bVar2 = ""[lVar12 + 1];
      paapVar5 = res->stats;
      AddConstantToken(tokens,(uint)(uVar3 >> 0xf),0x80);
      if (lVar1 == 0x10) break;
      stats_00 = paapVar5[bVar2] + lVar17;
      uVar7 = ((uint)bVar2 + iVar15) * 0x21 + iVar10;
      AddToken(tokens,(uint)(lVar12 < lVar11),uVar7,*stats_00);
      bVar6 = lVar12 < lVar11;
      lVar12 = lVar1;
    } while (bVar6);
LAB_0012f954:
    iVar15 = 1;
  }
  return iVar15;
}

Assistant:

int VP8RecordCoeffTokens(int ctx, const struct VP8Residual* const res,
                         VP8TBuffer* const tokens) {
  const int16_t* const coeffs = res->coeffs;
  const int coeff_type = res->coeff_type;
  const int last = res->last;
  int n = res->first;
  uint32_t base_id = TOKEN_ID(coeff_type, n, ctx);
  // should be stats[VP8EncBands[n]], but it's equivalent for n=0 or 1
  proba_t* s = res->stats[n][ctx];
  if (!AddToken(tokens, last >= 0, base_id + 0, s + 0)) {
    return 0;
  }

  while (n < 16) {
    const int c = coeffs[n++];
    const int sign = c < 0;
    const uint32_t v = sign ? -c : c;
    if (!AddToken(tokens, v != 0, base_id + 1, s + 1)) {
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 0);  // ctx=0
      s = res->stats[VP8EncBands[n]][0];
      continue;
    }
    if (!AddToken(tokens, v > 1, base_id + 2, s + 2)) {
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 1);  // ctx=1
      s = res->stats[VP8EncBands[n]][1];
    } else {
      if (!AddToken(tokens, v > 4, base_id + 3, s + 3)) {
        if (AddToken(tokens, v != 2, base_id + 4, s + 4)) {
          AddToken(tokens, v == 4, base_id + 5, s + 5);
        }
      } else if (!AddToken(tokens, v > 10, base_id + 6, s + 6)) {
        if (!AddToken(tokens, v > 6, base_id + 7, s + 7)) {
          AddConstantToken(tokens, v == 6, 159);
        } else {
          AddConstantToken(tokens, v >= 9, 165);
          AddConstantToken(tokens, !(v & 1), 145);
        }
      } else {
        int mask;
        const uint8_t* tab;
        uint32_t residue = v - 3;
        if (residue < (8 << 1)) {          // VP8Cat3  (3b)
          AddToken(tokens, 0, base_id + 8, s + 8);
          AddToken(tokens, 0, base_id + 9, s + 9);
          residue -= (8 << 0);
          mask = 1 << 2;
          tab = VP8Cat3;
        } else if (residue < (8 << 2)) {   // VP8Cat4  (4b)
          AddToken(tokens, 0, base_id + 8, s + 8);
          AddToken(tokens, 1, base_id + 9, s + 9);
          residue -= (8 << 1);
          mask = 1 << 3;
          tab = VP8Cat4;
        } else if (residue < (8 << 3)) {   // VP8Cat5  (5b)
          AddToken(tokens, 1, base_id + 8, s + 8);
          AddToken(tokens, 0, base_id + 10, s + 9);
          residue -= (8 << 2);
          mask = 1 << 4;
          tab = VP8Cat5;
        } else {                         // VP8Cat6 (11b)
          AddToken(tokens, 1, base_id + 8, s + 8);
          AddToken(tokens, 1, base_id + 10, s + 9);
          residue -= (8 << 3);
          mask = 1 << 10;
          tab = VP8Cat6;
        }
        while (mask) {
          AddConstantToken(tokens, !!(residue & mask), *tab++);
          mask >>= 1;
        }
      }
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 2);  // ctx=2
      s = res->stats[VP8EncBands[n]][2];
    }
    AddConstantToken(tokens, sign, 128);
    if (n == 16 || !AddToken(tokens, n <= last, base_id + 0, s + 0)) {
      return 1;   // EOB
    }
  }
  return 1;
}